

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void __thiscall
setup::info::try_load(info *this,istream *is,entry_types entries,codepage_id force_codepage)

{
  header *this_00;
  pointer plVar1;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> _Var2;
  istream *piVar3;
  bool bVar4;
  entry_types eVar5;
  pointer plVar6;
  pointer *__ptr;
  codepage_id codepage;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_48;
  entry_types entries_local;
  istream *local_38;
  
  entries_local = entries;
  eVar5 = operator|(Messages,NoSkip);
  if ((((ulong)eVar5._flags.super__Base_bitset<1UL>._M_w &
       (ulong)entries._flags.super__Base_bitset<1UL>._M_w) != 0) ||
     (bVar4 = version::is_unicode(&this->version), force_codepage == 0 && !bVar4)) {
    flags<setup::info::entry_types_Enum_,_21UL>::operator|=(&entries_local,Languages);
  }
  stream::block_reader::get((block_reader *)&local_48,is,&this->version);
  this_00 = &this->header;
  header::load(this_00,local_48._M_head_impl,&this->version);
  load_entries<setup::language_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).language_count,&this->languages
             ,Languages);
  bVar4 = version::is_unicode(&this->version);
  codepage = 0x4b0;
  if ((!bVar4) && (codepage = force_codepage, force_codepage == 0)) {
    plVar6 = (this->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar1 = (this->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (plVar6 != plVar1) {
      codepage = plVar6->codepage;
      this->codepage = codepage;
      bVar4 = true;
      while ((bVar4 && (plVar6 != plVar1))) {
        bVar4 = plVar6->codepage != 0x4e4;
        if (!bVar4) {
          this->codepage = 0x4e4;
          codepage = 0x4e4;
        }
        if (bVar4) {
          plVar6 = plVar6 + 1;
        }
      }
      goto LAB_00133d45;
    }
    codepage = 0x4e4;
  }
  this->codepage = codepage;
LAB_00133d45:
  header::decode(this_00,codepage);
  plVar1 = (this->languages).
           super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar4 = true;
  for (plVar6 = (this->languages).
                super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
                _M_impl.super__Vector_impl_data._M_start; (bVar4 && (plVar6 != plVar1));
      plVar6 = plVar6 + 1) {
    bVar4 = false;
    while (!bVar4) {
      language_entry::decode(plVar6,this->codepage);
      bVar4 = true;
    }
  }
  if ((this->version).value < 0x4000000) {
    anon_unknown_21::load_wizard_and_decompressor
              (local_48._M_head_impl,&this->version,this_00,this,entries_local);
  }
  load_entries<setup::message_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).message_count,&this->messages,
             Messages);
  load_entries<setup::permission_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).permission_count,
             &this->permissions,Permissions);
  load_entries<setup::type_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).type_count,&this->types,Types);
  load_entries<setup::component_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).component_count,
             &this->components,Components);
  load_entries<setup::task_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).task_count,&this->tasks,Tasks);
  load_entries<setup::directory_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).directory_count,
             &this->directories,Directories);
  load_entries<setup::file_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).file_count,&this->files,Files);
  load_entries<setup::icon_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).icon_count,&this->icons,Icons);
  load_entries<setup::ini_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).ini_entry_count,
             &this->ini_entries,IniEntries);
  load_entries<setup::registry_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).registry_entry_count,
             &this->registry_entries,RegistryEntries);
  load_entries<setup::delete_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).delete_entry_count,
             &this->delete_entries,DeleteEntries);
  load_entries<setup::delete_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).uninstall_delete_entry_count,
             &this->uninstall_delete_entries,UninstallDeleteEntries);
  load_entries<setup::run_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).run_entry_count,
             &this->run_entries,RunEntries);
  load_entries<setup::run_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).uninstall_run_entry_count,
             &this->uninstall_run_entries,UninstallRunEntries);
  if (0x3ffffff < (this->version).value) {
    anon_unknown_21::load_wizard_and_decompressor
              (local_48._M_head_impl,&this->version,this_00,this,entries_local);
  }
  anon_unknown_21::check_is_end((pointer *)&local_48,"unknown data at end of primary header stream")
  ;
  stream::block_reader::get((block_reader *)&local_38,is,&this->version);
  piVar3 = local_38;
  _Var2._M_head_impl = local_48._M_head_impl;
  local_38 = (istream *)0x0;
  local_48._M_head_impl = piVar3;
  if ((_Var2._M_head_impl != (istream *)0x0) &&
     ((*(_Var2._M_head_impl)->_vptr_basic_istream[1])(), local_38 != (istream *)0x0)) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  load_entries<setup::data_entry>
            (this,local_48._M_head_impl,entries_local,(this->header).data_entry_count,
             &this->data_entries,DataEntries);
  anon_unknown_21::check_is_end
            ((pointer *)&local_48,"unknown data at end of secondary header stream");
  if (local_48._M_head_impl != (istream *)0x0) {
    (*(local_48._M_head_impl)->_vptr_basic_istream[1])();
  }
  return;
}

Assistant:

void info::try_load(std::istream & is, entry_types entries, util::codepage_id force_codepage) {
	
	debug("trying to load setup headers for version " << version);
	
	if((entries & (Messages | NoSkip)) || (!version.is_unicode() && !force_codepage)) {
		entries |= Languages;
	}
	
	stream::block_reader::pointer reader = stream::block_reader::get(is, version);
	
	debug("loading main header");
	header.load(*reader, version);
	
	debug("loading languages");
	load_entries(*reader, entries, header.language_count, languages, Languages);
	
	debug("determining encoding");
	if(version.is_unicode()) {
		// Unicode installers are always UTF16-LE, do not allow users to override that.
		codepage = util::cp_utf16le;
	} else if(force_codepage) {
		codepage = force_codepage;
	} else if(languages.empty()) {
		codepage = util::cp_windows1252;
	} else {
		// Non-Unicode installers do not have a defined codepage but instead just assume the
		// codepage of the system the installer is run on.
		// Look at the list of available languages to guess a suitable codepage.
		codepage = languages[0].codepage;
		BOOST_FOREACH(const language_entry & language, languages) {
			if(language.codepage == util::cp_windows1252) {
				codepage = util::cp_windows1252;
				break;
			}
		}
	}
	
	header.decode(codepage);
	BOOST_FOREACH(language_entry & language, languages) {
		language.decode(codepage);
	}
	
	if(version < INNO_VERSION(4, 0, 0)) {
		debug("loading images and plugins");
		load_wizard_and_decompressor(*reader, version, header, *this, entries);
	}
	
	debug("loading messages");
	load_entries(*reader, entries, header.message_count, messages, Messages);
	debug("loading permissions");
	load_entries(*reader, entries, header.permission_count, permissions, Permissions);
	debug("loading types");
	load_entries(*reader, entries, header.type_count, types, Types);
	debug("loading components");
	load_entries(*reader, entries, header.component_count, components, Components);
	debug("loading tasks");
	load_entries(*reader, entries, header.task_count, tasks, Tasks);
	debug("loading directories");
	load_entries(*reader, entries, header.directory_count, directories, Directories);
	debug("loading files");
	load_entries(*reader, entries, header.file_count, files, Files);
	debug("loading icons");
	load_entries(*reader, entries, header.icon_count, icons, Icons);
	debug("loading ini entries");
	load_entries(*reader, entries, header.ini_entry_count, ini_entries, IniEntries);
	debug("loading registry entries");
	load_entries(*reader, entries, header.registry_entry_count, registry_entries, RegistryEntries);
	debug("loading delete entries");
	load_entries(*reader, entries, header.delete_entry_count, delete_entries, DeleteEntries);
	debug("loading uninstall delete entries");
	load_entries(*reader, entries, header.uninstall_delete_entry_count, uninstall_delete_entries,
	             UninstallDeleteEntries);
	debug("loading run entries");
	load_entries(*reader, entries, header.run_entry_count, run_entries, RunEntries);
	debug("loading uninstall run entries");
	load_entries(*reader, entries, header.uninstall_run_entry_count, uninstall_run_entries,
	             UninstallRunEntries);
	
	if(version >= INNO_VERSION(4, 0, 0)) {
		debug("loading images and plugins");
		load_wizard_and_decompressor(*reader, version, header, *this, entries);
	}
	
	// restart the compression stream
	check_is_end(reader, "unknown data at end of primary header stream");
	reader = stream::block_reader::get(is, version);
	
	debug("loading data entries");
	load_entries(*reader, entries, header.data_entry_count, data_entries, DataEntries);
	
	check_is_end(reader, "unknown data at end of secondary header stream");
}